

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfKeyCodeAttribute.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::KeyCode>::writeValueTo
          (TypedAttribute<Imf_2_5::KeyCode> *this,OStream *os,int version)

{
  KeyCode *this_00;
  int local_1c;
  
  this_00 = &this->_value;
  local_1c = KeyCode::filmMfcCode(this_00);
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = KeyCode::filmType(this_00);
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = KeyCode::prefix(this_00);
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = KeyCode::count(this_00);
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = KeyCode::perfOffset(this_00);
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = KeyCode::perfsPerFrame(this_00);
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_1c = KeyCode::perfsPerCount(this_00);
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  return;
}

Assistant:

void
KeyCodeAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.filmMfcCode());
    Xdr::write <StreamIO> (os, _value.filmType());
    Xdr::write <StreamIO> (os, _value.prefix());
    Xdr::write <StreamIO> (os, _value.count());
    Xdr::write <StreamIO> (os, _value.perfOffset());
    Xdr::write <StreamIO> (os, _value.perfsPerFrame());
    Xdr::write <StreamIO> (os, _value.perfsPerCount());
}